

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

bool __thiscall slang::parsing::Lexer::isNextTokenOnSameLine(Lexer *this)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *pbVar5;
  byte bVar6;
  
  pbVar1 = (byte *)this->sourceBuffer;
  pbVar3 = pbVar1;
LAB_001b0ab6:
  uVar4 = (ulong)*pbVar3;
  if (0x2f < uVar4) {
LAB_001b0b36:
    bVar2 = true;
LAB_001b0b2b:
    this->sourceBuffer = (char *)pbVar1;
    return bVar2;
  }
  if ((0x100001a00U >> (uVar4 & 0x3f) & 1) != 0) {
    pbVar3 = pbVar3 + 1;
    goto LAB_001b0ac9;
  }
  if (uVar4 == 0x2f) {
    if (pbVar3[1] == 0x2a) {
      pbVar3 = pbVar3 + 2;
LAB_001b0ae4:
      this->sourceBuffer = (char *)pbVar3;
      bVar6 = *pbVar3;
      pbVar5 = pbVar3;
      if (bVar6 == 0x2a) {
        this->sourceBuffer = (char *)(pbVar3 + 1);
        bVar6 = pbVar3[1];
        pbVar5 = pbVar3 + 1;
        if (bVar6 == 0x2f) goto LAB_001b0b18;
      }
      pbVar3 = pbVar5 + 1;
      if ((bVar6 == 0) && (this->sourceEnd + -1 <= pbVar5)) goto LAB_001b0b29;
      goto LAB_001b0ae4;
    }
    if (pbVar3[1] != 0x2f) goto LAB_001b0b36;
  }
  else if ((0x2401UL >> (uVar4 & 0x3f) & 1) == 0) goto LAB_001b0b36;
LAB_001b0b29:
  bVar2 = false;
  goto LAB_001b0b2b;
LAB_001b0b18:
  pbVar3 = pbVar3 + 2;
LAB_001b0ac9:
  this->sourceBuffer = (char *)pbVar3;
  goto LAB_001b0ab6;
}

Assistant:

bool Lexer::isNextTokenOnSameLine() {
    auto guard = ScopeGuard([this, currBuff = sourceBuffer] { sourceBuffer = currBuff; });

    while (true) {
        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                break;
            case '/':
                switch (peek(1)) {
                    case '/':
                        return false;
                    case '*':
                        advance(2);
                        while (true) {
                            if (consume('*') && consume('/'))
                                break;
                            if (peek() == '\0' && reallyAtEnd())
                                return false;
                            advance();
                        }
                        break;
                    default:
                        return true;
                }
                break;
            case '\0':
            case '\r':
            case '\n':
                return false;
            default:
                return true;
        }
    }
}